

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::HlslParseContext::addSwitch
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *expression,
          TIntermAggregate *lastStatements,TAttributes *attributes)

{
  TIntermediate *this_00;
  TVector<TIntermNode_*> *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppTVar4;
  size_type sVar5;
  TIntermBranch *node;
  TIntermAggregate *this_01;
  undefined4 extraout_var_02;
  HlslParseContext *this_02;
  TIntermTyped *s;
  TIntermSwitch *switchNode;
  TIntermAggregate *body;
  TString *local_40;
  TIntermSequence *switchSequence;
  TAttributes *attributes_local;
  TIntermAggregate *lastStatements_local;
  TIntermTyped *expression_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  switchSequence = (TIntermSequence *)attributes;
  attributes_local = (TAttributes *)lastStatements;
  lastStatements_local = (TIntermAggregate *)expression;
  expression_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  wrapupSwitchSubsequence(this,lastStatements,(TIntermNode *)0x0);
  if ((lastStatements_local != (TIntermAggregate *)0x0) &&
     ((iVar2 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(), iVar2 == 8 ||
      (iVar2 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(), iVar2 == 9)))) {
    iVar2 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1e])();
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xe8))();
    if ((uVar3 & 1) == 0) {
      iVar2 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xe0))();
      if ((uVar3 & 1) == 0) {
        iVar2 = (*(lastStatements_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode
                  ._vptr_TIntermNode[0x1e])();
        uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xd8))();
        if ((uVar3 & 1) == 0) goto LAB_0057e591;
      }
    }
  }
  lastStatements = (TIntermAggregate *)expression_local;
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,expression_local,"condition must be a scalar integer expression","switch","");
LAB_0057e591:
  ppTVar4 = std::__cxx11::
            list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            ::back(&(this->super_TParseContextBase).switchSequenceStack.
                    super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                  );
  local_40 = (TString *)*ppTVar4;
  sVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_40);
  if (sVar5 == 0) {
    this_local = (HlslParseContext *)lastStatements_local;
  }
  else {
    if (attributes_local == (TAttributes *)0x0) {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      node = TIntermediate::addBranch
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpBreak,
                        (TSourceLoc *)expression_local);
      attributes_local =
           (TAttributes *)TIntermediate::makeAggregate(this_00,&node->super_TIntermNode);
      (*(((TIntermAggregate *)attributes_local)->super_TIntermOperator).super_TIntermTyped.
        super_TIntermNode._vptr_TIntermNode[0x31])(attributes_local,1);
      body = (TIntermAggregate *)attributes_local;
      lastStatements = (TIntermAggregate *)&body;
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)local_40,
                 (value_type *)lastStatements);
    }
    this_01 = (TIntermAggregate *)
              TIntermNode::operator_new((TIntermNode *)0x188,(size_t)lastStatements);
    TIntermAggregate::TIntermAggregate(this_01,EOpSequence);
    ppTVar4 = std::__cxx11::
              list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
              ::back(&(this->super_TParseContextBase).switchSequenceStack.
                      super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
                    );
    pTVar1 = *ppTVar4;
    iVar2 = (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    TVector<TIntermNode_*>::operator=
              ((TVector<TIntermNode_*> *)CONCAT44(extraout_var_02,iVar2),pTVar1);
    s = expression_local;
    (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])();
    this_02 = (HlslParseContext *)TIntermNode::operator_new((TIntermNode *)0x38,(size_t)s);
    TIntermSwitch::TIntermSwitch
              ((TIntermSwitch *)this_02,(TIntermTyped *)lastStatements_local,this_01);
    (*(this_02->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[1])
              (this_02,expression_local);
    handleSwitchAttributes
              (this,(TSourceLoc *)expression_local,(TIntermSwitch *)this_02,
               (TAttributes *)switchSequence);
    this_local = this_02;
  }
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* HlslParseContext::addSwitch(const TSourceLoc& loc, TIntermTyped* expression,
                                         TIntermAggregate* lastStatements, const TAttributes& attributes)
{
    wrapupSwitchSubsequence(lastStatements, nullptr);

    if (expression == nullptr ||
        (expression->getBasicType() != EbtInt && expression->getBasicType() != EbtUint) ||
        expression->getType().isArray() || expression->getType().isMatrix() || expression->getType().isVector())
        error(loc, "condition must be a scalar integer expression", "switch", "");

    // If there is nothing to do, drop the switch but still execute the expression
    TIntermSequence* switchSequence = switchSequenceStack.back();
    if (switchSequence->size() == 0)
        return expression;

    if (lastStatements == nullptr) {
        // emulate a break for error recovery
        lastStatements = intermediate.makeAggregate(intermediate.addBranch(EOpBreak, loc));
        lastStatements->setOperator(EOpSequence);
        switchSequence->push_back(lastStatements);
    }

    TIntermAggregate* body = new TIntermAggregate(EOpSequence);
    body->getSequence() = *switchSequenceStack.back();
    body->setLoc(loc);

    TIntermSwitch* switchNode = new TIntermSwitch(expression, body);
    switchNode->setLoc(loc);
    handleSwitchAttributes(loc, switchNode, attributes);

    return switchNode;
}